

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O3

compile_errcode __thiscall SwitchStatement::Generate(SwitchStatement *this)

{
  pointer pcVar1;
  SymbolName SVar2;
  compile_errcode cVar3;
  char *__end;
  undefined4 uVar4;
  string expression_string;
  Pcode pcode;
  string local_1d8;
  SwitchTable *local_1b8;
  string *local_1b0;
  Expression *local_1a8;
  Default *local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  Pcode local_f8;
  string local_70;
  string local_50;
  
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1b0 = &this->m_bottom_label;
  local_1a0 = &this->m_default;
  local_1b8 = &this->m_switch_table;
  local_1a8 = &this->m_expression;
  uVar4 = 0;
LAB_0014e310:
  SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
  switch(uVar4) {
  case 0:
    uVar4 = 1;
    if (SVar2 != SWITCH_SYM) goto LAB_0014e684;
    break;
  case 1:
    uVar4 = 2;
    if (SVar2 != L_CIRCLE_BRACKET_SYM) goto LAB_0014e684;
    break;
  case 2:
    uVar4 = 3;
    Expression::Generate(local_1a8,&local_1d8);
    goto LAB_0014e310;
  case 3:
    uVar4 = 4;
    if (SVar2 != R_CIRCLE_BRACKET_SYM) goto LAB_0014e684;
    break;
  case 4:
    uVar4 = 5;
    if (SVar2 != L_CURLY_BRACKET_SYM) goto LAB_0014e684;
    break;
  case 5:
    goto switchD_0014e331_caseD_5;
  case 6:
    cVar3 = Default::Generate(local_1a0);
    uVar4 = 7;
    if (cVar3 != 0) {
      if (SVar2 == R_CURLY_BRACKET_SYM) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        pcVar1 = (this->m_bottom_label)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,pcVar1,pcVar1 + (this->m_bottom_label)._M_string_length);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
        Pcode::Pcode(&local_f8,LABEL,&local_138,&local_158,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        std::vector<Pcode,_std::allocator<Pcode>_>::push_back
                  (&pcode_generator->m_pcode_queue,&local_f8);
        goto LAB_0014e608;
      }
      goto LAB_0014e684;
    }
    goto LAB_0014e310;
  case 7:
    if (SVar2 != R_CURLY_BRACKET_SYM) goto LAB_0014e684;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    pcVar1 = (this->m_bottom_label)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar1,pcVar1 + (this->m_bottom_label)._M_string_length);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
    Pcode::Pcode(&local_f8,LABEL,&local_178,&local_198,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::vector<Pcode,_std::allocator<Pcode>_>::push_back(&pcode_generator->m_pcode_queue,&local_f8)
    ;
LAB_0014e608:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.m_comment._M_dataplus._M_p != &local_f8.m_comment.field_2) {
      operator_delete(local_f8.m_comment._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.m_num3._M_dataplus._M_p != &local_f8.m_num3.field_2) {
      operator_delete(local_f8.m_num3._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.m_num2._M_dataplus._M_p != &local_f8.m_num2.field_2) {
      operator_delete(local_f8.m_num2._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.m_num1._M_dataplus._M_p != &local_f8.m_num1.field_2) {
      operator_delete(local_f8.m_num1._M_dataplus._M_p);
    }
    uVar4 = 8;
    break;
  case 8:
    cVar3 = 0;
    goto LAB_0014e689;
  }
  SymbolQueue::NextSymbol(handle_correct_queue);
  goto LAB_0014e310;
switchD_0014e331_caseD_5:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_1d8._M_dataplus._M_p,
             local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
  cVar3 = SwitchTable::Generate(local_1b8,&local_118,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  uVar4 = 6;
  if (cVar3 != 0) {
LAB_0014e684:
    cVar3 = -1;
LAB_0014e689:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    return cVar3;
  }
  goto LAB_0014e310;
}

Assistant:

compile_errcode SwitchStatement::Generate() {
    int ret = COMPILE_OK;
    int state = 0;
    string expression_string;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == SWITCH_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Generate(expression_string)) == COMPILE_OK) {
                    state = 3;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 4: {
                if (name == L_CURLY_BRACKET_SYM) {
                    state = 5;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 5: {
                if ((ret = m_switch_table.Generate(expression_string, m_bottom_label)) == COMPILE_OK) {
                    state = 6;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 6: {
                if ((ret = m_default.Generate()) == COMPILE_OK) {
                    state = 7;
                    break;
                } else if (name == R_CURLY_BRACKET_SYM) {
                    Pcode pcode(LABEL, m_bottom_label, EMPTY_STR, EMPTY_STR);
                    pcode_generator->Insert(pcode);
                    state = 8;
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 7: {
                if (name == R_CURLY_BRACKET_SYM) {
                    state = 8;
                    Pcode pcode(LABEL, m_bottom_label, EMPTY_STR, EMPTY_STR);
                    pcode_generator->Insert(pcode);
                    break;
                } else {
                    goto ERROR_SWITCH;
                }
            }
            case 8: return COMPILE_OK;
        }
        if (state != 3 && state != 6 && state != 7)
            handle_correct_queue->NextSymbol();
    }
    ERROR_SWITCH:
       return NOT_MATCH;
}